

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cc
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  ulong uVar2;
  initializer_list<const_SSM::Observable_*> __l;
  Values values;
  Observables observables;
  ResultHandler handler;
  KnockSignal2 knock_2;
  KnockSignal1 knock_1;
  NeutralPositionSwitch nt_sw;
  KnockingCorrection kn_corr;
  ThrottlePedal thr;
  EngineLoad en_load;
  AirFuelLeanCorrection af_lean_corr;
  IntakeAirTemperature intake_temp;
  ExhaustGasTemperature exhaust_gas_temp;
  ManifoldRelativePressure manifold_pressure;
  EngineSpeed engine_speed;
  BatteryVoltage battery_voltage;
  ECUPort ECU;
  void *local_178;
  void *local_170;
  long local_168;
  vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_> local_160;
  undefined8 *local_148;
  undefined8 uStack_140;
  code *local_138;
  code *pcStack_130;
  Observable *local_128;
  undefined ***local_120;
  Observable local_118;
  undefined ***local_110;
  undefined ***local_108;
  undefined ***local_100;
  undefined ***local_f8;
  undefined ***local_f0;
  undefined ***local_e8;
  undefined ***local_e0;
  undefined ***local_d8;
  undefined ***local_d0;
  undefined **local_c8;
  undefined **local_c0;
  undefined **local_b8;
  undefined **local_b0;
  undefined **local_a8;
  undefined **local_a0;
  undefined **local_98;
  undefined **local_90;
  undefined **local_88;
  undefined **local_80;
  undefined **local_78;
  Observable local_70;
  Observable local_68 [7];
  
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"/dev/ttyUSB0","");
  SSM::ECUPort::ECUPort((ECUPort *)local_68,(string *)&local_128);
  if (local_128 != &local_118) {
    operator_delete(local_128,(long)local_118._vptr_Observable + 1);
  }
  local_128 = &local_70;
  local_70._vptr_Observable = (_func_int **)&PTR_convert_001068a8;
  local_120 = &local_78;
  local_78 = &PTR_convert_00106930;
  local_118._vptr_Observable = (_func_int **)&local_80;
  local_80 = &PTR_convert_001069a8;
  local_110 = &local_88;
  local_88 = &PTR_convert_00106a08;
  local_108 = &local_90;
  local_90 = &PTR_convert_00106a68;
  local_100 = &local_98;
  local_98 = &PTR_convert_00106ac8;
  local_f8 = &local_a0;
  local_a0 = &PTR_convert_00106b28;
  local_f0 = &local_a8;
  local_a8 = &PTR_convert_00106b88;
  local_e8 = &local_b0;
  local_b0 = &PTR_convert_00106be8;
  local_e0 = &local_b8;
  local_b8 = &PTR_convert_00106c48;
  local_d8 = &local_c0;
  local_c0 = &PTR_convert_00106cb8;
  local_d0 = &local_c8;
  local_c8 = &PTR_convert_00106d10;
  __l._M_len = 0xc;
  __l._M_array = &local_128;
  std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::vector
            (&local_160,__l,(allocator_type *)&local_178);
  SSM::ECUPort::singleRead((vector *)&local_178);
  if ((long)local_160.
            super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_160.
            super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>.
            _M_impl.super__Vector_impl_data._M_start == (long)local_170 - (long)local_178) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Single read results:",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    if (local_170 != local_178) {
      uVar2 = 0;
      do {
        SSM::ECUPort::isAvailable(local_68);
        poVar1 = std::ostream::_M_insert<bool>(true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," | ",3);
        poVar1 = std::ostream::_M_insert<double>(*(double *)((long)local_178 + uVar2 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        (*local_160.
          super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar2]->_vptr_Observable[1])(&local_128);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(char *)local_128,(long)local_120);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        if (local_128 != &local_118) {
          operator_delete(local_128,(long)local_118._vptr_Observable + 1);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)((long)local_170 - (long)local_178 >> 3));
    }
    local_128 = (Observable *)0x64;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nStarting continuous read:",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    local_138 = (code *)0x0;
    pcStack_130 = (code *)0x0;
    local_148 = (undefined8 *)0x0;
    uStack_140 = 0;
    local_148 = (undefined8 *)operator_new(0x18);
    *local_148 = ResultHandler::handle;
    local_148[1] = 0;
    local_148[2] = &local_128;
    pcStack_130 = std::
                  _Function_handler<int_(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&),_std::_Bind<int_(ResultHandler::*(ResultHandler_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>_>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<int_(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&),_std::_Bind<int_(ResultHandler::*(ResultHandler_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>_>
                ::_M_manager;
    SSM::ECUPort::continuousRead(local_68,&local_160);
    if (local_138 != (code *)0x0) {
      (*local_138)(&local_148,&local_148,3);
    }
    if (local_178 != (void *)0x0) {
      operator_delete(local_178,local_168 - (long)local_178);
    }
    if (local_160.
        super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_160.
                      super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_160.
                            super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_160.
                            super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    SSM::ECUPort::~ECUPort((ECUPort *)local_68);
    return 0;
  }
  __assert_fail("observables.size() == values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Silvan-K[P]libsubarussm/src/Example.cc"
                ,0x3f,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv)
{
  SSM::ECUPort ECU("/dev/ttyUSB0");

  SSM::BatteryVoltage           battery_voltage;
  SSM::EngineSpeed              engine_speed;
  SSM::ManifoldRelativePressure manifold_pressure;
  SSM::ExhaustGasTemperature    exhaust_gas_temp;
  SSM::IntakeAirTemperature     intake_temp;
  SSM::AirFuelLeanCorrection    af_lean_corr;
  SSM::EngineLoad               en_load;
  SSM::ThrottlePedal            thr;
  SSM::KnockingCorrection       kn_corr;
  SSM::NeutralPositionSwitch    nt_sw;
  SSM::KnockSignal1             knock_1;
  SSM::KnockSignal2             knock_2;
  
  SSM::Observables observables { &battery_voltage,
				 &engine_speed,
				 &manifold_pressure,
				 &exhaust_gas_temp,
				 &intake_temp,
				 &af_lean_corr,
				 &en_load,
				 &thr,
				 &kn_corr,
				 &nt_sw,
				 &knock_1,
				 &knock_2 };

  SSM::Values values = ECU.singleRead(observables);
  assert(observables.size() == values.size());

  std::cout << "Single read results:" << std::endl;
  for(int i(0); i<values.size(); i++)
    std::cout << ECU.isAvailable(*observables[i])
	      << " | " << values[i] << " "
	      << observables[i]->unit() << std::endl;

  ResultHandler handler(100);
  auto callback = std::bind(&ResultHandler::handle, 
			    &handler, 
			    std::placeholders::_1,
			    std::placeholders::_2);

  std::cout << "\nStarting continuous read:" << std::endl;
  ECU.continuousRead(observables, callback);
}